

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c.c
# Opt level: O1

void free_context(s98c *ctx)

{
  long lVar1;
  ulong uVar2;
  
  if (ctx->devices != (s98deviceinfo *)0x0) {
    free(ctx->devices);
  }
  if (ctx->tags != (s98taginfo *)0x0) {
    if (ctx->tags_count != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        free(*(void **)((long)&ctx->tags->key + lVar1));
        free(*(void **)((long)&ctx->tags->value + lVar1));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (uVar2 < ctx->tags_count);
    }
    free(ctx->tags);
  }
  if (ctx->dump_buffer != (uint8_t *)0x0) {
    free(ctx->dump_buffer);
  }
  if (ctx->source_encoding != (char *)0x0) {
    free(ctx->source_encoding);
    return;
  }
  return;
}

Assistant:

void free_context(struct s98c* ctx)
{
    if(ctx->devices != NULL) {
        free(ctx->devices);
    }
    if(ctx->tags != NULL) {
        int i;
        for(i = 0; i < ctx->tags_count; i++) {
            free(ctx->tags[i].key);
            free(ctx->tags[i].value);
        }
        free(ctx->tags);
    }
    if(ctx->dump_buffer != NULL) {
        free(ctx->dump_buffer);
    }
    if(ctx->source_encoding != NULL) {
        free(ctx->source_encoding);
    }
}